

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem-disk-unix.c++
# Opt level: O2

Own<kj::Directory::Replacer<kj::Directory>,_std::nullptr_t> __thiscall
kj::anon_unknown_9::DiskDirectory::replaceSubdir(DiskDirectory *this,PathPtr path,WriteMode mode)

{
  Directory *pDVar1;
  int osErrorNumber;
  undefined8 *puVar2;
  undefined4 in_register_0000000c;
  Replacer<kj::Directory> *extraout_RDX;
  char *__file;
  WriteMode in_R8D;
  size_t *this_00;
  Own<kj::Directory::Replacer<kj::Directory>,_std::nullptr_t> OVar3;
  PathPtr finalName;
  OwnFd local_c0;
  OwnFd local_bc;
  Fault f;
  size_t sStack_b0;
  ArrayDisposer *local_a8;
  String temp;
  Own<kj::Directory,_std::nullptr_t> local_78;
  mode_t acl;
  Own<kj::Function<int_(kj::StringPtr)>::Iface,_std::nullptr_t> local_60;
  PathPtr local_50;
  Own<const_kj::Directory,_std::nullptr_t> local_40;
  
  finalName.parts.size_ = CONCAT44(in_register_0000000c,mode);
  finalName.parts.ptr = (String *)path.parts.size_;
  this_00 = &((path.parts.ptr)->content).size_;
  acl = 0x1c0;
  if ((in_R8D & PRIVATE) == 0) {
    acl = 0x1ff;
  }
  local_50.parts.ptr = finalName.parts.ptr;
  local_50.parts.size_ = finalName.parts.size_;
  local_60.ptr = (Iface *)operator_new(0x18);
  (local_60.ptr)->_vptr_Iface = (_func_int **)&PTR_operator___00279b58;
  local_60.ptr[1]._vptr_Iface = (_func_int **)this_00;
  local_60.ptr[2]._vptr_Iface = (_func_int **)&acl;
  local_60.disposer =
       (Disposer *)
       &kj::_::
        HeapDisposer<kj::Function<int(kj::StringPtr)>::Impl<kj::(anonymous_namespace)::DiskHandle::replaceSubdir(kj::PathPtr,kj::WriteMode)const::{lambda(kj::StringPtr)#1}>>
        ::instance;
  DiskHandle::createNamedTemporary
            (&temp,(DiskHandle *)this_00,finalName,in_R8D,(Function<int_(kj::StringPtr)> *)&local_60
            );
  Own<kj::Function<int_(kj::StringPtr)>::Iface,_std::nullptr_t>::dispose(&local_60);
  do {
    __file = "";
    if (temp.content.size_ != 0) {
      __file = temp.content.ptr;
    }
    local_c0.fd = openat64((int)*this_00,__file,0x90000);
    if (-1 < local_c0.fd) goto LAB_001dccdf;
    osErrorNumber = kj::_::Debug::getOsErrorNumber(false);
  } while (osErrorNumber == -1);
  if (osErrorNumber != 0) {
    kj::_::Debug::Fault::Fault
              (&f,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
               ,0x579,osErrorNumber,"open(just-created-temporary)","");
    kj::_::Debug::Fault::fatal(&f);
  }
LAB_001dccdf:
  local_bc.fd = -1;
  newDiskDirectory((kj *)&local_78,&local_c0);
  PathPtr::toString((String *)&f,&local_50,false);
  puVar2 = (undefined8 *)operator_new(0x60);
  pDVar1 = local_78.ptr;
  local_40.disposer = local_78.disposer;
  local_78.ptr = (Directory *)0x0;
  *(WriteMode *)(puVar2 + 1) = in_R8D;
  *puVar2 = &PTR_get_00279bc0;
  puVar2[2] = local_78.disposer;
  puVar2[3] = pDVar1;
  local_40.ptr = (Directory *)0x0;
  puVar2[4] = this_00;
  puVar2[5] = temp.content.ptr;
  puVar2[6] = temp.content.size_;
  puVar2[7] = temp.content.disposer;
  temp.content.ptr = (char *)0x0;
  temp.content.size_ = 0;
  puVar2[8] = f.exception;
  puVar2[9] = sStack_b0;
  puVar2[10] = local_a8;
  f.exception = (Exception *)0x0;
  *(undefined1 *)(puVar2 + 0xb) = 0;
  Own<const_kj::Directory,_std::nullptr_t>::dispose(&local_40);
  (this->super_Directory).super_ReadableDirectory.super_FsNode._vptr_FsNode =
       (_func_int **)
       &kj::_::HeapDisposer<kj::(anonymous_namespace)::DiskHandle::ReplacerImpl<kj::Directory>>::
        instance;
  *(undefined8 **)&this->super_DiskHandle = puVar2;
  Array<char>::~Array((Array<char> *)&f);
  Own<kj::Directory,_std::nullptr_t>::dispose(&local_78);
  OwnFd::~OwnFd(&local_c0);
  OwnFd::~OwnFd(&local_bc);
  Array<char>::~Array(&temp.content);
  OVar3.ptr = extraout_RDX;
  OVar3.disposer = (Disposer *)this;
  return OVar3;
}

Assistant:

Own<Replacer<Directory>> replaceSubdir(PathPtr path, WriteMode mode) const override {
    return DiskHandle::replaceSubdir(path, mode);
  }